

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

UriType * __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::CreateSchema(GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
               *this,SchemaType **schema,PointerType *pointer,ValueType *v,ValueType *document,
              UriType *id)

{
  bool bVar1;
  SchemaType *pSVar2;
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  *this_00;
  Stack<rapidjson::CrtAllocator> local_68;
  
  if (pointer->parseErrorCode_ == kPointerParseErrorNone) {
    local_68.stack_ = (char *)0x0;
    local_68.stackTop_ = (char *)0x0;
    local_68.allocator_ = (CrtAllocator *)0x0;
    local_68.ownAllocator_ = (CrtAllocator *)0x0;
    local_68.stackEnd_ = (char *)0x0;
    local_68.initialCapacity_ = 0x100;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
    ::Stringify<true,rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
              ((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                *)pointer,
               (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_68);
    if ((v->data_).f.flags == 3) {
      pSVar2 = GetSchema(this,pointer);
      if (pSVar2 == (SchemaType *)0x0) {
        bVar1 = HandleRefSchema(this,pointer,schema,v,document,id);
        if (!bVar1) {
          this_00 = (Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                     *)malloc(0x1a8);
          internal::
          Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
          ::Schema(this_00,this,pointer,v,document,this->allocator_,id);
          if (schema != (SchemaType **)0x0) {
            *schema = this_00;
          }
          id = &this_00->id_;
        }
      }
      else {
        if (schema != (SchemaType **)0x0) {
          *schema = pSVar2;
        }
        AddSchemaRefs(this,pSVar2);
      }
    }
    else {
      pSVar2 = this->typeless_;
      if (schema != (SchemaType **)0x0) {
        *schema = pSVar2;
      }
      AddSchemaRefs(this,pSVar2);
    }
    internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_68);
    return id;
  }
  __assert_fail("pointer.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/schema.h"
                ,0x881,
                "const UriType &rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>::CreateSchema(const SchemaType **, const PointerType &, const ValueType &, const ValueType &, const UriType &) [ValueT = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

Hasher(Allocator* allocator = 0, size_t stackCapacity = kDefaultSize) : stack_(allocator, stackCapacity) {}